

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::TestResult::RecordProperty
          (TestResult *this,string *xml_element,TestProperty *test_property)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  __last;
  bool bVar2;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  _Var3;
  allocator local_69;
  long *local_68;
  long local_60;
  long local_58 [2];
  TestPropertyKeyIs local_48;
  
  bVar2 = ValidateTestProperty(xml_element,test_property);
  if (bVar2) {
    internal::MutexBase::Lock((MutexBase *)this);
    _Var3._M_current =
         (this->test_properties_).
         super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->test_properties_).
         super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::__cxx11::string::string
              ((string *)&local_68,(test_property->key_)._M_dataplus._M_p,&local_69);
    paVar1 = &local_48.key_.field_2;
    local_48.key_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_68,local_60 + (long)local_68);
    _Var3 = std::
            find_if<__gnu_cxx::__normal_iterator<testing::TestProperty*,std::vector<testing::TestProperty,std::allocator<testing::TestProperty>>>,testing::internal::TestPropertyKeyIs>
                      (_Var3,__last,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.key_._M_dataplus._M_p,local_48.key_.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    if (_Var3._M_current ==
        (this->test_properties_).
        super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::push_back
                (&this->test_properties_,test_property);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_68,(test_property->value_)._M_dataplus._M_p,&local_69);
      std::__cxx11::string::_M_assign((string *)&(_Var3._M_current)->value_);
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
    }
    internal::MutexBase::Unlock((MutexBase *)this);
  }
  return;
}

Assistant:

void TestResult::RecordProperty(const std::string& xml_element,
                                const TestProperty& test_property) {
  if (!ValidateTestProperty(xml_element, test_property)) {
    return;
  }
  internal::MutexLock lock(&test_properties_mutex_);
  const std::vector<TestProperty>::iterator property_with_matching_key =
      std::find_if(test_properties_.begin(), test_properties_.end(),
                   internal::TestPropertyKeyIs(test_property.key()));
  if (property_with_matching_key == test_properties_.end()) {
    test_properties_.push_back(test_property);
    return;
  }
  property_with_matching_key->SetValue(test_property.value());
}